

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void google::protobuf::compiler::anon_unknown_0::FormatFreeFieldNumbers
               (string *name,
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *ranges)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  pointer ppVar6;
  ostream *this;
  _Self local_58;
  _Self local_50;
  const_iterator i;
  int next_free_number;
  undefined1 local_38 [8];
  string output;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *ranges_local;
  string *name_local;
  
  output.field_2._8_8_ = ranges;
  std::__cxx11::string::string((string *)local_38);
  uVar5 = std::__cxx11::string::c_str();
  StringAppendF((string *)local_38,"%-35s free:",uVar5);
  i._M_node._0_4_ = 1;
  local_50._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       ::begin((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)output.field_2._8_8_);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)output.field_2._8_8_);
    bVar3 = std::operator!=(&local_50,&local_58);
    uVar1 = (uint)i._M_node;
    if (!bVar3) break;
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_50);
    uVar2 = (uint)i._M_node;
    if ((int)uVar1 < ppVar6->second) {
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_50);
      if ((int)uVar2 < ppVar6->first) {
        iVar4 = (uint)i._M_node + 1;
        ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_50);
        uVar1 = (uint)i._M_node;
        if (iVar4 == ppVar6->first) {
          StringAppendF((string *)local_38," %d",(ulong)(uint)i._M_node);
        }
        else {
          ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_50);
          StringAppendF((string *)local_38," %d-%d",(ulong)uVar1,(ulong)(ppVar6->first - 1));
        }
      }
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_50);
      i._M_node._0_4_ = ppVar6->second;
    }
    std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator++(&local_50);
  }
  if ((int)(uint)i._M_node < 0x20000000) {
    StringAppendF((string *)local_38," %d-INF",(ulong)(uint)i._M_node);
  }
  this = std::operator<<((ostream *)&std::cout,(string *)local_38);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void FormatFreeFieldNumbers(const string& name,
                            const std::set<FieldRange>& ranges) {
  string output;
  StringAppendF(&output, "%-35s free:", name.c_str());
  int next_free_number = 1;
  for (std::set<FieldRange>::const_iterator i = ranges.begin();
       i != ranges.end(); ++i) {
    // This happens when groups re-use parent field numbers, in which
    // case we skip the FieldRange entirely.
    if (next_free_number >= i->second) continue;

    if (next_free_number < i->first) {
      if (next_free_number + 1 == i->first) {
        // Singleton
        StringAppendF(&output, " %d", next_free_number);
      } else {
        // Range
        StringAppendF(&output, " %d-%d", next_free_number, i->first - 1);
      }
    }
    next_free_number = i->second;
  }
  if (next_free_number <= FieldDescriptor::kMaxNumber) {
    StringAppendF(&output, " %d-INF", next_free_number);
  }
  std::cout << output << std::endl;
}